

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
common_sampler_sample_and_accept_n
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,common_sampler *gsmpl,
          llama_context *ctx,vector<int,_std::allocator<int>_> *idxs,llama_tokens *draft,
          bool grammar_first)

{
  pointer piVar1;
  ulong uVar2;
  ulong uVar3;
  size_type __n;
  llama_token id;
  vector<int,_std::allocator<int>_> *local_40;
  llama_token id_1;
  
  __n = (long)(idxs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(idxs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start >> 2;
  if (__n != ((long)(draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2) + 1U) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
               ,0x184,"GGML_ASSERT(%s) failed",
               "idxs.size() == draft.size() + 1 && \"idxs.size() must be draft.size() + 1\"");
  }
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = __return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,__n);
  piVar1 = (draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar3 = 0;
  do {
    uVar2 = (long)(draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
    if (uVar2 <= uVar3) {
LAB_001e97c8:
      if (uVar2 == uVar3) {
        id_1 = common_sampler_sample
                         (gsmpl,ctx,
                          (idxs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar3],grammar_first);
        common_sampler_accept(gsmpl,id_1,true);
        std::vector<int,_std::allocator<int>_>::push_back(local_40,&id_1);
      }
      return local_40;
    }
    id = common_sampler_sample
                   (gsmpl,ctx,
                    (idxs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar3],grammar_first);
    common_sampler_accept(gsmpl,id,true);
    std::vector<int,_std::allocator<int>_>::push_back(local_40,&id);
    piVar1 = (draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if (piVar1[uVar3] != id) {
      uVar2 = (long)(draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
      goto LAB_001e97c8;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

std::vector<llama_token> common_sampler_sample_and_accept_n(struct common_sampler * gsmpl, struct llama_context * ctx, const std::vector<int> & idxs, const llama_tokens & draft, bool grammar_first) {
    GGML_ASSERT(idxs.size() == draft.size() + 1 && "idxs.size() must be draft.size() + 1");

    std::vector<llama_token> result;
    result.reserve(idxs.size());

    size_t i = 0;
    for (; i < draft.size(); i++) {
        const llama_token id = common_sampler_sample(gsmpl, ctx, idxs[i], grammar_first);

        common_sampler_accept(gsmpl, id, true);

        result.push_back(id);

        if (draft[i] != id) {
            break;
        }
    }

    if (i == draft.size()) {
        const llama_token id = common_sampler_sample(gsmpl, ctx, idxs[i], grammar_first);

        common_sampler_accept(gsmpl, id, true);

        result.push_back(id);
    }

    return result;
}